

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O1

void __thiscall
midi_container::scan_for_loops
          (midi_container *this,bool p_xmi_loops,bool p_marker_loops,bool p_rpgmaker_loops,
          bool p_touhou_loops)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pmVar4;
  pointer puVar5;
  int iVar6;
  pointer pmVar7;
  ulong *puVar8;
  size_type sVar9;
  size_type sVar10;
  pointer pmVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  ulong *puVar18;
  long lVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong uVar22;
  pointer *ppmVar23;
  ulong uVar24;
  bool bVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ulong local_60;
  size_type local_58;
  ulong local_50;
  pointer local_48;
  size_type local_40;
  size_t local_38;
  
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar10 = 1;
  if (this->m_form == 2) {
    sVar10 = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  this_00 = &this->m_timestamp_loop_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,sVar10);
  this_01 = &this->m_timestamp_loop_end;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,sVar10);
  if (sVar10 != 0) {
    puVar2 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      puVar2[sVar9] = 0xffffffffffffffff;
      puVar3[sVar9] = 0xffffffffffffffff;
      sVar9 = sVar9 + 1;
    } while (sVar10 != sVar9);
  }
  uVar1 = this->m_form;
  if (p_touhou_loops && uVar1 == 0) {
    pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    pmVar4 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar14 = false;
    lVar15 = 0;
    do {
      if (lVar15 == ((long)pmVar4 - (long)pmVar7 >> 3) * -0x5555555555555555) goto LAB_00107c5d;
      if (!bVar14) {
        lVar13 = *(long *)&pmVar7[lVar15].m_events.
                           super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        puVar2 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar17 = ((long)*(pointer *)
                         ((long)&pmVar7[lVar15].m_events.
                                 super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                         + 8) - lVar13 >> 6) + 1;
        pcVar16 = (char *)(lVar13 + 0x19);
        while (lVar17 = lVar17 + -1, lVar17 != 0) {
          bVar25 = true;
          if (*(int *)(pcVar16 + -0x11) == 3) {
            if (pcVar16[-1] == '\x02') {
              if (*pcVar16 == '\0') {
                *puVar2 = *(unsigned_long *)(pcVar16 + -0x19);
                goto LAB_00107c13;
              }
LAB_00107c20:
              bVar14 = true;
              bVar25 = false;
            }
            else {
LAB_00107c13:
              if (pcVar16[-1] == '\x04') {
                if (*pcVar16 != '\0') goto LAB_00107c20;
                *puVar3 = *(unsigned_long *)(pcVar16 + -0x19);
                bVar25 = true;
              }
            }
          }
          if ((!bVar25) || (pcVar16 = pcVar16 + 0x40, bVar14)) break;
        }
      }
      lVar15 = lVar15 + 1;
    } while (!bVar14);
    *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
     super__Vector_impl_data._M_start = 0xffffffffffffffff;
    *(this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
     super__Vector_impl_data._M_start = 0xffffffffffffffff;
  }
LAB_00107c5d:
  if (p_rpgmaker_loops) {
    pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pmVar7;
    if (lVar15 != 0) {
      lVar15 = (lVar15 >> 3) * -0x5555555555555555;
      lVar13 = 0;
      bVar14 = false;
      do {
        lVar17 = 0;
        if (uVar1 == 2) {
          lVar17 = lVar13;
        }
        puVar8 = *(ulong **)
                  &pmVar7[lVar13].m_events.
                   super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        lVar19 = (long)*(pointer *)
                        ((long)&pmVar7[lVar13].m_events.
                                super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                        + 8) - (long)puVar8;
        if (lVar19 != 0) {
          puVar2 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar24 = 1;
          do {
            bVar25 = true;
            if (((int)puVar8[1] == 3) && (((byte)puVar8[3] & 0xfe) == 0x6e)) {
              if ((byte)puVar8[3] == 0x6e) {
                bVar14 = true;
                bVar25 = false;
              }
              else {
                uVar12 = puVar2[lVar17];
                if ((uVar12 == 0xffffffffffffffff) || (bVar25 = true, *puVar8 < uVar12)) {
                  puVar2[lVar17] = *puVar8;
                  bVar25 = true;
                }
              }
            }
            if (!bVar25) break;
            puVar8 = puVar8 + 8;
            bVar25 = uVar24 < (ulong)(lVar19 >> 6);
            uVar24 = uVar24 + 1;
          } while (bVar25);
        }
        if (bVar14) {
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar17] = 0xffffffffffffffff;
          (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar17] = 0xffffffffffffffff;
          break;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar15 + (ulong)(lVar15 == 0));
    }
  }
  if (p_xmi_loops) {
    pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pmVar7;
    if (lVar15 != 0) {
      lVar15 = (lVar15 >> 3) * -0x5555555555555555;
      lVar13 = 0;
      do {
        puVar8 = *(ulong **)
                  &pmVar7[lVar13].m_events.
                   super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        lVar17 = (long)*(pointer *)
                        ((long)&pmVar7[lVar13].m_events.
                                super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                        + 8) - (long)puVar8;
        if (lVar17 != 0) {
          lVar17 = lVar17 >> 6;
          lVar19 = 0;
          if (uVar1 == 2) {
            lVar19 = lVar13;
          }
          puVar20 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar19;
          puVar18 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar19;
          lVar17 = lVar17 + (ulong)(lVar17 == 0);
          do {
            if (((int)puVar8[1] == 3) && (((byte)puVar8[3] & 0xfc) == 0x74)) {
              if ((byte)((byte)puVar8[3] | 2) == 0x76) {
                puVar21 = puVar20;
                if ((*puVar20 == 0xffffffffffffffff) || (*puVar8 < *puVar20)) {
LAB_00107e21:
                  *puVar21 = *puVar8;
                }
              }
              else {
                puVar21 = puVar18;
                if ((*puVar18 == 0xffffffffffffffff) || (*puVar18 < *puVar8)) goto LAB_00107e21;
              }
            }
            puVar8 = puVar8 + 8;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar15 + (ulong)(lVar15 == 0));
    }
  }
  local_58 = sVar10;
  if ((p_marker_loops) &&
     (pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
     super__Vector_impl_data._M_finish != pmVar7)) {
    uVar24 = 0;
    do {
      local_60 = 0;
      if (this->m_form == 2) {
        local_60 = uVar24;
      }
      pmVar11 = pmVar7[uVar24].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_50 = uVar24;
      if (pmVar7[uVar24].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
          _M_impl.super__Vector_impl_data._M_finish != pmVar11) {
        pmVar7 = pmVar7 + uVar24;
        lVar15 = 0;
        uVar24 = 0;
        local_48 = pmVar7;
        do {
          if ((((*(int *)(pmVar11->m_data + lVar15 + -0x10) == 7) &&
               (uVar12 = (*(long *)(pmVar11->m_data + lVar15 + -8) +
                         *(long *)(pmVar11->m_data + lVar15 + 0x18)) -
                         *(long *)(pmVar11->m_data + lVar15 + 0x10), 8 < uVar12)) &&
              (pmVar11->m_data[lVar15] == 0xff)) && (pmVar11->m_data[lVar15 + 1] == '\x06')) {
            sVar10 = uVar12 - 2;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_78,sVar10);
            puVar5 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar22 = ((*(long *)(pmVar11->m_data + lVar15 + -8) +
                      *(long *)(pmVar11->m_data + lVar15 + 0x18)) -
                     *(long *)(pmVar11->m_data + lVar15 + 0x10)) - 2;
            if (sVar10 <= uVar22) {
              uVar22 = sVar10;
            }
            local_38 = uVar22;
            if (0xd < uVar22) {
              local_38 = 0xe;
            }
            local_40 = sVar10;
            memcpy(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,pmVar11->m_data + lVar15 + 2,local_38);
            if (0xe < uVar22) {
              memcpy(puVar5 + local_38,*(void **)(pmVar11->m_data + lVar15 + 0x10),uVar22 - local_38
                    );
            }
            pmVar7 = local_48;
            if (uVar12 == 9) {
LAB_00107f7e:
              iVar6 = strncasecmp((char *)local_78.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,"loopEnd",7);
              if (iVar6 == 0) {
                puVar8 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_60;
                if ((*puVar8 == 0xffffffffffffffff) ||
                   (*puVar8 < *(ulong *)(pmVar11->m_data + lVar15 + -0x18))) {
LAB_00107fda:
                  *puVar8 = *(ulong *)(pmVar11->m_data + lVar15 + -0x18);
                }
              }
            }
            else if (uVar12 == 0xb) {
              iVar6 = strncasecmp((char *)local_78.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,"loopStart",9);
              if (iVar6 == 0) {
                puVar8 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_60;
                if ((*puVar8 == 0xffffffffffffffff) ||
                   (*(ulong *)(pmVar11->m_data + lVar15 + -0x18) < *puVar8)) goto LAB_00107fda;
              }
              else if (local_40 == 7) goto LAB_00107f7e;
            }
          }
          uVar24 = uVar24 + 1;
          pmVar11 = (pmVar7->m_events).super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar15 + 0x40;
        } while (uVar24 < (ulong)((long)(pmVar7->m_events).
                                        super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pmVar11 >>
                                 6));
      }
      uVar24 = local_50 + 1;
      pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)(((long)(this->m_tracks).
                                     super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pmVar7 >> 3)
                             * -0x5555555555555555));
  }
  if (local_58 != 0) {
    uVar1 = this->m_form;
    pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pmVar4 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = ((long)pmVar7 - (long)pmVar4 >> 3) * -0x5555555555555555;
    puVar2 = (this->m_timestamp_loop_start).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_timestamp_loop_end).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar10 = 0;
    do {
      if (uVar1 == 2) {
        uVar24 = pmVar4[sVar10].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].m_timestamp;
      }
      else if (pmVar7 == pmVar4) {
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        ppmVar23 = &(pmVar4->m_events).super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        lVar13 = lVar15 + (ulong)(lVar15 == 0);
        do {
          if (uVar24 < (*ppmVar23)[-1].m_timestamp) {
            uVar24 = (*ppmVar23)[-1].m_timestamp;
          }
          ppmVar23 = ppmVar23 + 3;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      uVar12 = puVar2[sVar10];
      if ((uVar12 != 0xffffffffffffffff) && ((uVar12 == puVar3[sVar10] || (uVar12 == uVar24)))) {
        puVar2[sVar10] = 0xffffffffffffffff;
        puVar3[sVar10] = 0xffffffffffffffff;
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != local_58);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void midi_container::scan_for_loops( bool p_xmi_loops, bool p_marker_loops, bool p_rpgmaker_loops, bool p_touhou_loops )
{
    std::vector<uint8_t> data;

    unsigned long subsong_count = m_form == 2 ? m_tracks.size() : 1;

    m_timestamp_loop_start.resize( subsong_count );
    m_timestamp_loop_end.resize( subsong_count );

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        m_timestamp_loop_start[ i ] = ~0UL;
        m_timestamp_loop_end[ i ] = ~0UL;
    }

    if ( p_touhou_loops && m_form == 0 )
    {
        bool loop_start_found = false;
        bool loop_end_found = false;
        bool errored = false;

        for ( unsigned long i = 0; !errored && i < m_tracks.size(); ++i )
        {
            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; !errored && j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change )
                {
                    if ( event.m_data[ 0 ] == 2 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_start[ 0 ] = event.m_timestamp;
                        loop_start_found = true;
                    }
                    if ( event.m_data[ 0 ] == 4 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_end[ 0 ] = event.m_timestamp;
                        loop_end_found = true;
                    }
                }
            }
        }

        if ( errored )
        {
            m_timestamp_loop_start[ 0 ] = ~0UL;
            m_timestamp_loop_end[ 0 ] = ~0UL;
        }
    }

    if ( p_rpgmaker_loops )
    {
        bool emidi_commands_found = false;

        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] == 110 || event.m_data[ 0 ] == 111 ) )
                {
                    if ( event.m_data[ 0 ] == 110 )
                    {
                        emidi_commands_found = true;
                        break;
                    }
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }

            if ( emidi_commands_found )
            {
                m_timestamp_loop_start[ subsong ] = ~0UL;
                m_timestamp_loop_end[ subsong ] = ~0UL;
                break;
            }
        }
    }

    if ( p_xmi_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] >= 0x74 && event.m_data[ 0 ] <= 0x77 ) )
                {
                    if ( event.m_data[ 0 ] == 0x74 || event.m_data[ 0 ] == 0x76 )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    if ( p_marker_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::extended &&
                    event.get_data_count() >= 9 &&
                    event.m_data[ 0 ] == 0xFF && event.m_data[ 1 ] == 0x06 )
                {
                    unsigned long data_count = event.get_data_count() - 2;
                    data.resize( data_count );
                    event.copy_data( &data[0], 2, data_count );

                    if ( data_count == 9 && !strncasecmp( (const char *) &data[0], "loopStart", 9 ) )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else if ( data_count == 7 && !strncasecmp( (const char *) &data[0], "loopEnd", 7 ) )
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    // Sanity

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        unsigned long timestamp_song_end;
        if ( m_form == 2 )
            timestamp_song_end = m_tracks[i][m_tracks[i].get_count()-1].m_timestamp;
        else
        {
            timestamp_song_end = 0;
            for (unsigned long j = 0; j < m_tracks.size(); ++j)
            {
                const midi_track & track = m_tracks[j];
                unsigned long timestamp = track[track.get_count()-1].m_timestamp;
                if (timestamp > timestamp_song_end)
                    timestamp_song_end = timestamp;
            }
        }
        if ( m_timestamp_loop_start[ i ] != ~0UL && ( ( m_timestamp_loop_start[ i ] == m_timestamp_loop_end[ i ] ) || ( m_timestamp_loop_start[ i ] == timestamp_song_end ) ) )
        {
            m_timestamp_loop_start[ i ] = ~0UL;
            m_timestamp_loop_end[ i ] = ~0UL;
        }
    }
}